

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridDataType1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType1 *this)

{
  ushort *puVar1;
  ostream *poVar2;
  ushort *puVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::operator<<(local_1a0,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"GridDataType1:");
  poVar2 = std::operator<<(poVar2,"\n\tField Scale:      ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&(this->super_GridData).field_0xc);
  poVar2 = std::operator<<(poVar2,"\n\tField Offset:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32FieldOffset);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Values: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumValues);
  std::operator<<(poVar2,"\n\tValues: ");
  std::__cxx11::string::~string((string *)&local_1d0);
  puVar1 = (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vui16Values).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::operator<<(local_1a0," ");
    std::ostream::operator<<(poVar2,*puVar3);
  }
  std::operator<<(local_1a0,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType1::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType1:"
       << "\n\tField Scale:      " << m_f32FieldScale
       << "\n\tField Offset:     " << m_f32FieldOffset
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KUINT16>::const_iterator citr = m_vui16Values.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vui16Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}